

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar * __thiscall
icu_63::Normalizer2Impl::composeQuickCheck
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool onlyContiguous,
          UNormalizationCheckResult *pQCResult)

{
  UChar UVar1;
  UChar UVar2;
  uint16_t norm16;
  UChar UVar3;
  void *pvVar4;
  UBool UVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  ushort norm16_00;
  int iVar9;
  UCPTrie *pUVar10;
  UChar *pUVar11;
  byte bVar12;
  ushort uVar13;
  UChar *pUVar14;
  long lVar15;
  UChar *pUVar16;
  UChar *local_60;
  
  UVar1 = this->minCompNoMaybeCP;
  pUVar16 = src;
  if (limit == (UChar *)0x0) {
    lVar15 = 2;
    pUVar14 = src + -2;
    do {
      pUVar11 = pUVar14;
      pUVar14 = pUVar11 + 1;
      lVar15 = lVar15 + -2;
      if (pUVar11[2] == L'\0') break;
    } while ((ushort)pUVar11[2] < (ushort)UVar1);
    pUVar11 = pUVar11 + 2;
    limit = u_strchr_63(pUVar11,L'\0');
    if ((lVar15 != 0) &&
       (UVar5 = hasCompBoundaryAfter(this,(uint)(ushort)*pUVar14,onlyContiguous), src = pUVar11,
       pUVar16 = pUVar11, UVar5 == '\0')) {
      src = pUVar14;
      pUVar16 = pUVar14;
    }
  }
LAB_002febd8:
  do {
    while( true ) {
      pUVar14 = pUVar16;
      if (pUVar14 == limit) {
        return pUVar14;
      }
      UVar2 = *pUVar14;
      if ((ushort)UVar1 <= (ushort)UVar2) break;
LAB_002fec18:
      pUVar16 = pUVar14 + 1;
    }
    pUVar10 = this->normTrie;
    pvVar4 = (pUVar10->data).ptr0;
    norm16_00 = *(ushort *)
                 ((long)pvVar4 +
                 (ulong)(((ushort)UVar2 & 0x3f) + (uint)pUVar10->index[(ushort)UVar2 >> 6]) * 2);
    uVar7 = this->minNoNo;
    if (norm16_00 < uVar7) goto LAB_002fec18;
    pUVar16 = pUVar14 + 1;
    if (((ushort)UVar2 & 0xfc00) == 0xd800) {
      if ((pUVar16 == limit) || ((*pUVar16 & 0xfc00U) != 0xdc00)) goto LAB_002febd8;
      iVar9 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)*pUVar16 + -0x35fdc00;
      if (iVar9 < pUVar10->highStart) {
        iVar9 = ucptrie_internalSmallIndex_63(pUVar10,iVar9);
        uVar7 = this->minNoNo;
      }
      else {
        iVar9 = pUVar10->dataLength + -2;
      }
      pUVar16 = pUVar14 + 2;
      norm16_00 = *(ushort *)((long)pvVar4 + (long)iVar9 * 2);
      if (norm16_00 < uVar7) goto LAB_002febd8;
    }
    uVar8 = 1;
    pUVar11 = src;
    if (src != pUVar14) {
      UVar5 = norm16HasCompBoundaryBefore(this,norm16_00);
      pUVar11 = pUVar14;
      if (UVar5 == '\0') {
        local_60 = pUVar14 + -1;
        UVar2 = pUVar14[-1];
        if ((UVar2 & 0xf800U) == 0xd800) {
          if (((((ushort)UVar2 >> 10 & 1) == 0) || (local_60 == src)) ||
             ((pUVar14[-2] & 0xfc00U) != 0xd800)) {
            pUVar10 = this->normTrie;
            iVar9 = pUVar10->dataLength + -1;
          }
          else {
            local_60 = pUVar14 + -2;
            iVar9 = (uint)(ushort)UVar2 + (uint)(ushort)pUVar14[-2] * 0x400 + -0x35fdc00;
            pUVar10 = this->normTrie;
            if (iVar9 < pUVar10->highStart) {
              iVar9 = ucptrie_internalSmallIndex_63(pUVar10,iVar9);
              pUVar10 = this->normTrie;
            }
            else {
              iVar9 = pUVar10->dataLength + -2;
            }
          }
        }
        else {
          pUVar10 = this->normTrie;
          iVar9 = ((ushort)UVar2 & 0x3f) + (uint)pUVar10->index[(ushort)UVar2 >> 6];
        }
        norm16 = *(uint16_t *)((long)(pUVar10->data).ptr0 + (long)iVar9 * 2);
        UVar5 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous);
        uVar8 = 1;
        if (UVar5 == '\0') {
          pUVar11 = local_60;
          uVar8 = (uint)norm16;
        }
      }
      else {
        uVar8 = 1;
      }
    }
    uVar7 = this->minMaybeYes;
    if (norm16_00 < uVar7) goto LAB_002fef22;
    uVar13 = norm16_00 >> 1;
    if (norm16_00 < 0xfc00) {
      uVar13 = 0;
    }
    if (((onlyContiguous != '\0') && ((byte)uVar13 != 0)) &&
       ((this->minYesNo < (ushort)uVar8 &&
        ((byte)uVar13 < *(byte *)((long)this->extraData + (ulong)(uVar8 & 0xfffe) + 1)))))
    goto LAB_002fef22;
    do {
      src = pUVar16;
      if (norm16_00 < 0xfe02) {
        if (pQCResult == (UNormalizationCheckResult *)0x0) {
          return pUVar11;
        }
        *pQCResult = UNORM_MAYBE;
      }
      if (src == limit) {
        return src;
      }
      pUVar16 = src + 1;
      UVar2 = *src;
      if ((UVar2 & 0xf800U) == 0xd800) {
        if ((((ushort)UVar2 >> 10 & 1) == 0) && (pUVar16 != limit)) {
          UVar3 = *pUVar16;
          pUVar10 = this->normTrie;
          if ((UVar3 & 0xfc00U) == 0xdc00) {
            pUVar16 = src + 2;
            iVar9 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar3 + -0x35fdc00;
            if (iVar9 < pUVar10->highStart) {
              iVar9 = ucptrie_internalSmallIndex_63(pUVar10,iVar9);
              pUVar10 = this->normTrie;
              uVar7 = this->minMaybeYes;
            }
            else {
              iVar9 = pUVar10->dataLength + -2;
            }
            goto LAB_002feeb4;
          }
        }
        else {
          pUVar10 = this->normTrie;
        }
        iVar9 = pUVar10->dataLength + -1;
      }
      else {
        pUVar10 = this->normTrie;
        iVar9 = ((ushort)UVar2 & 0x3f) + (uint)pUVar10->index[(ushort)UVar2 >> 6];
      }
LAB_002feeb4:
      norm16_00 = *(ushort *)((long)(pUVar10->data).ptr0 + (long)iVar9 * 2);
      if (norm16_00 < uVar7) break;
      if (norm16_00 < 0xfc00) {
        uVar6 = 0;
      }
      else {
        uVar6 = norm16_00 >> 1;
      }
      bVar12 = (byte)uVar13;
      uVar13 = uVar6;
    } while ((byte)uVar6 == 0 || bVar12 <= (byte)uVar6);
    if (this->minNoNo <= norm16_00) {
LAB_002fef22:
      if (pQCResult != (UNormalizationCheckResult *)0x0) {
        *pQCResult = UNORM_NO;
      }
      return pUVar11;
    }
  } while( true );
}

Assistant:

const UChar *
Normalizer2Impl::composeQuickCheck(const UChar *src, const UChar *limit,
                                   UBool onlyContiguous,
                                   UNormalizationCheckResult *pQCResult) const {
    const UChar *prevBoundary=src;
    UChar32 minNoMaybeCP=minCompNoMaybeCP;
    if(limit==NULL) {
        UErrorCode errorCode=U_ZERO_ERROR;
        src=copyLowPrefixFromNulTerminated(src, minNoMaybeCP, NULL, errorCode);
        limit=u_strchr(src, 0);
        if (prevBoundary != src) {
            if (hasCompBoundaryAfter(*(src-1), onlyContiguous)) {
                prevBoundary = src;
            } else {
                prevBoundary = --src;
            }
        }
    }

    for(;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const UChar *prevSrc;
        UChar32 c = 0;
        uint16_t norm16 = 0;
        for (;;) {
            if(src==limit) {
                return src;
            }
            if( (c=*src)<minNoMaybeCP ||
                isCompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else {
                prevSrc = src++;
                if(!U16_IS_LEAD(c)) {
                    break;
                } else {
                    UChar c2;
                    if(src!=limit && U16_IS_TRAIL(c2=*src)) {
                        ++src;
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                        norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                        if(!isCompYesAndZeroCC(norm16)) {
                            break;
                        }
                    }
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        uint16_t prevNorm16 = INERT;
        if (prevBoundary != prevSrc) {
            if (norm16HasCompBoundaryBefore(norm16)) {
                prevBoundary = prevSrc;
            } else {
                const UChar *p = prevSrc;
                uint16_t n16;
                UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, prevBoundary, p, c, n16);
                if (norm16HasCompBoundaryAfter(n16, onlyContiguous)) {
                    prevBoundary = prevSrc;
                } else {
                    prevBoundary = p;
                    prevNorm16 = n16;
                }
            }
        }

        if(isMaybeOrNonZeroCC(norm16)) {
            uint8_t cc=getCCFromYesOrMaybe(norm16);
            if (onlyContiguous /* FCC */ && cc != 0 &&
                    getTrailCCFromCompYesAndZeroCC(prevNorm16) > cc) {
                // The [prevBoundary..prevSrc[ character
                // passed the quick check "yes && ccc==0" test
                // but is out of canonical order with the current combining mark.
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const UChar *nextSrc;
                for (;;) {
                    if (norm16 < MIN_YES_YES_WITH_CC) {
                        if (pQCResult != nullptr) {
                            *pQCResult = UNORM_MAYBE;
                        } else {
                            return prevBoundary;
                        }
                    }
                    if (src == limit) {
                        return src;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, c, norm16);
                    if (isMaybeOrNonZeroCC(norm16)) {
                        cc = getCCFromYesOrMaybe(norm16);
                        if (!(prevCC <= cc || cc == 0)) {
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                if (isCompYesAndZeroCC(norm16)) {
                    prevBoundary = src;
                    src = nextSrc;
                    continue;
                }
            }
        }
        if(pQCResult!=NULL) {
            *pQCResult=UNORM_NO;
        }
        return prevBoundary;
    }
}